

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void GameLoop(Board *board)

{
  ostream *this;
  int local_1c;
  int local_18;
  int x;
  int frames;
  char choice;
  bool exit;
  Board *board_local;
  
  _frames = board;
  system("clear");
  Board::PrintBoard(_frames);
  x._3_1_ = 0;
  do {
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,1000);
    std::operator<<((ostream *)&std::cout,
                    "(n)ext iteration / (s)pecify frames to advance, / e(x)it: ");
    std::operator>>((istream *)&std::cin,(char *)((long)&x + 2));
    if (x._2_1_ == 'n') {
      Board::Tick(_frames);
      system("clear");
      Board::PrintBoard(_frames);
    }
    else if (x._2_1_ == 's') {
      local_18 = 1;
      std::operator<<((ostream *)&std::cout,"Enter the number of frames you would like to advance: "
                     );
      std::istream::operator>>((istream *)&std::cin,&local_18);
      for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
        Board::Tick(_frames);
        system("clear");
        Board::PrintBoard(_frames);
        usleep(100000);
      }
    }
    else if (x._2_1_ == 'x') {
      x._3_1_ = 1;
    }
    else {
      this = std::operator<<((ostream *)&std::cout,"Invalid selection. Please try again.");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
  } while (((x._3_1_ ^ 0xff) & 1) != 0);
  return;
}

Assistant:

void GameLoop(Board &board)
{
    system("clear");
    board.PrintBoard();
    bool exit = false;
    do
    {
        char choice;

        //Just in case the user entered extra/invalid input
        std::cin.clear();
        std::cin.ignore(1000, '\n');

        std::cout << "(n)ext iteration / (s)pecify frames to advance, / e(x)it: ";
        std::cin >> choice;
        switch(choice)
        {
            case 'n':
                board.Tick();
                system("clear");
                board.PrintBoard();
                break;
            case 's':
            {
                int frames = 1;
                std::cout << "Enter the number of frames you would like to advance: ";
                std::cin >> frames;
                for (int x = 0; x < frames; x++)
                {
                    board.Tick();
                    system("clear");
                    board.PrintBoard();
                    usleep(100000);
                }
                break;
            }
            case 'x':
                exit = true;
                break;
            default:
                std::cout << "Invalid selection. Please try again." << std::endl;
                break;
        }
    } while(!exit);
}